

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int LoadEXRImageFromMemory
              (EXRImage *exr_image,EXRHeader *exr_header,uchar *memory,size_t size,char **err)

{
  ulong in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  uchar *marker;
  uchar *head;
  char **in_stack_00000270;
  size_t in_stack_00000278;
  uchar *in_stack_00000280;
  uchar *in_stack_00000288;
  EXRHeader *in_stack_00000290;
  EXRImage *in_stack_00000298;
  char **in_stack_ffffffffffffff48;
  string *in_stack_ffffffffffffff50;
  string *msg;
  undefined1 local_89 [56];
  allocator local_51;
  string local_50 [76];
  int local_4;
  
  if (((in_RDI == 0) || (in_RDX == 0)) || (in_RCX < 8)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_50,"Invalid argument for LoadEXRImageFromMemory",&local_51);
    tinyexr::SetErrorMessage(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    local_4 = -3;
  }
  else if (*(int *)(in_RSI + 0x58) == 0) {
    msg = (string *)local_89;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_89 + 1),"EXRHeader variable is not initialized.",(allocator *)msg);
    tinyexr::SetErrorMessage(msg,in_stack_ffffffffffffff48);
    std::__cxx11::string::~string((string *)(local_89 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_89);
    local_4 = -3;
  }
  else {
    local_4 = tinyexr::DecodeEXRImage
                        (in_stack_00000298,in_stack_00000290,in_stack_00000288,in_stack_00000280,
                         in_stack_00000278,in_stack_00000270);
  }
  return local_4;
}

Assistant:

int LoadEXRImageFromMemory(EXRImage *exr_image, const EXRHeader *exr_header,
                           const unsigned char *memory, const size_t size,
                           const char **err) {
  if (exr_image == NULL || memory == NULL ||
      (size < tinyexr::kEXRVersionSize)) {
    tinyexr::SetErrorMessage("Invalid argument for LoadEXRImageFromMemory",
                             err);
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  if (exr_header->header_len == 0) {
    tinyexr::SetErrorMessage("EXRHeader variable is not initialized.", err);
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  const unsigned char *head = memory;
  const unsigned char *marker = reinterpret_cast<const unsigned char *>(
      memory + exr_header->header_len +
      8);  // +8 for magic number + version header.
  return tinyexr::DecodeEXRImage(exr_image, exr_header, head, marker, size,
                                 err);
}